

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

char * fmt::v6::internal::sprintf_format<long_double>
                 (longdouble value,buffer<char> *buf,sprintf_specs specs)

{
  bool bVar1;
  uint uVar2;
  undefined2 *puVar3;
  _func_int **pp_Var4;
  byte *pbVar5;
  byte bVar6;
  byte bVar7;
  byte *pbVar8;
  byte bVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  char format [10];
  char local_5a;
  undefined1 local_59 [2];
  undefined1 local_57 [7];
  ulong local_50;
  byte *local_48;
  longdouble local_3c;
  
  local_3c = value;
  uVar10 = (ulong)specs >> 0x20;
  local_5a = '%';
  bVar9 = specs.type;
  if (((ulong)specs >> 0x28 & 1) == 0 && bVar9 != 0) {
    puVar3 = (undefined2 *)local_59;
  }
  else {
    puVar3 = (undefined2 *)(local_59 + 1);
    local_59[0] = 0x23;
  }
  if (-1 < specs.precision) {
    *puVar3 = 0x2a2e;
    puVar3 = puVar3 + 1;
  }
  *(undefined1 *)puVar3 = 0x4c;
  bVar6 = bVar9;
  if (bVar9 == 0x6e) {
    bVar6 = 0x67;
  }
  if (bVar9 == 0) {
    bVar6 = 0x67;
  }
  bVar7 = 0x66;
  if (bVar9 != 0x25) {
    bVar7 = bVar6;
  }
  *(byte *)((long)puVar3 + 1) = bVar7;
  *(undefined1 *)(puVar3 + 1) = 0;
  local_48 = (byte *)0x0;
  do {
    uVar2 = format_float<long_double>(buf->ptr_,buf->capacity_,&local_5a,specs.precision,local_3c);
    if ((int)uVar2 < 0) {
      bVar1 = true;
      if (buf->capacity_ != 0xffffffffffffffff) {
        uVar12 = buf->capacity_ + 1;
        pp_Var4 = buf->_vptr_buffer;
LAB_0014e4f4:
        (**pp_Var4)(buf,uVar12);
      }
    }
    else {
      uVar12 = (ulong)uVar2;
      uVar13 = buf->capacity_;
      bVar1 = uVar13 <= uVar12;
      if (uVar12 < uVar13) {
        pbVar8 = (byte *)buf->ptr_;
        if ((*pbVar8 == 0x2d) || (pbVar11 = pbVar8, *pbVar8 == 0x2b)) {
          pbVar11 = pbVar8 + 1;
        }
        if (((bVar9 & 0xdf) != 0x41) && (pbVar8 = pbVar8 + uVar12, pbVar11 < pbVar8)) {
LAB_0014e52d:
          pbVar5 = pbVar11 + 1;
          if ((byte)(*pbVar11 - 0x30) < 10) break;
          if (((*pbVar11 | 0x20) != 0x65) && (local_48 = pbVar11, (char)uVar10 == '\0')) {
            pbVar11 = pbVar11 + 2;
            if (*pbVar5 != 0x30) {
              pbVar11 = pbVar5;
            }
            for (; (pbVar11 != pbVar8 && ((byte)(*pbVar11 - 0x31) < 9)); pbVar11 = pbVar11 + 1) {
            }
            bVar14 = pbVar11 == pbVar8;
            pbVar5 = pbVar11;
            local_50 = uVar10;
            if (bVar14) {
LAB_0014e5b8:
              uVar2 = uVar2 + ((int)pbVar11 - (int)pbVar5);
              uVar10 = local_50;
            }
            else {
              bVar6 = *pbVar11;
              while (bVar6 == 0x30) {
                pbVar5 = pbVar5 + 1;
                bVar14 = pbVar5 == pbVar8;
                if (bVar14) goto LAB_0014e5b8;
                bVar6 = *pbVar5;
              }
              if (bVar14) goto LAB_0014e5b8;
              if ((byte)(*pbVar5 - 0x3a) < 0xf6) {
                memmove(pbVar11,pbVar5,(long)pbVar8 - (long)pbVar5);
                goto LAB_0014e5b8;
              }
            }
          }
        }
LAB_0014e5c3:
        uVar13 = (ulong)uVar2;
        if (buf->capacity_ < uVar13) {
          (**buf->_vptr_buffer)(buf,uVar13);
        }
        buf->size_ = uVar13;
      }
      else {
        uVar12 = (ulong)(uVar2 + 1);
        if (uVar13 < uVar12) {
          pp_Var4 = buf->_vptr_buffer;
          goto LAB_0014e4f4;
        }
      }
    }
    if (!bVar1) {
      return (char *)local_48;
    }
  } while( true );
  pbVar11 = pbVar5;
  if (pbVar8 <= pbVar5) goto LAB_0014e5c3;
  goto LAB_0014e52d;
}

Assistant:

char* sprintf_format(Double value, internal::buffer<char>& buf,
                     sprintf_specs specs) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() != 0, "empty buffer");

  // Build format string.
  enum { max_format_size = 10 };  // longest format: %#-*.*Lg
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.alt || !specs.type) *format_ptr++ = '#';
  if (specs.precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<Double, long double>::value) *format_ptr++ = 'L';

  char type = specs.type;

  if (type == '%')
    type = 'f';
  else if (type == 0 || type == 'n')
    type = 'g';
#if FMT_MSC_VER
  if (type == 'F') {
    // MSVC's printf doesn't support 'F'.
    type = 'f';
  }
#endif
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  char* start = nullptr;
  char* decimal_point_pos = nullptr;
  for (;;) {
    std::size_t buffer_size = buf.capacity();
    start = &buf[0];
    int result =
        format_float(start, buffer_size, format, specs.precision, value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buf.capacity()) {
        // Find the decimal point.
        auto p = buf.data(), end = p + n;
        if (*p == '+' || *p == '-') ++p;
        if (specs.type != 'a' && specs.type != 'A') {
          while (p < end && *p >= '0' && *p <= '9') ++p;
          if (p < end && *p != 'e' && *p != 'E') {
            decimal_point_pos = p;
            if (!specs.type) {
              // Keep only one trailing zero after the decimal point.
              ++p;
              if (*p == '0') ++p;
              while (p != end && *p >= '1' && *p <= '9') ++p;
              char* where = p;
              while (p != end && *p == '0') ++p;
              if (p == end || *p < '0' || *p > '9') {
                if (p != end) std::memmove(where, p, to_unsigned(end - p));
                n -= static_cast<unsigned>(p - where);
              }
            }
          }
        }
        buf.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buf.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buf.reserve(buf.capacity() + 1);
    }
  }
  return decimal_point_pos;
}